

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS
ref_smooth_add_pliant_force
          (REF_NODE ref_node,REF_INT center,REF_INT neighbor,REF_DBL *total_force_vector)

{
  double dVar1;
  double dVar2;
  double local_b0;
  double local_a0;
  double local_98;
  double local_88;
  double local_80;
  double local_70;
  double dStack_60;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL ratio;
  REF_DBL l4;
  REF_DBL force;
  REF_DBL norm [3];
  REF_INT ixyz;
  REF_DBL *total_force_vector_local;
  REF_INT neighbor_local;
  REF_INT center_local;
  REF_NODE ref_node_local;
  
  for (norm[2]._4_4_ = 0; norm[2]._4_4_ < 3; norm[2]._4_4_ = norm[2]._4_4_ + 1) {
    norm[(long)norm[2]._4_4_ + -1] =
         ref_node->real[norm[2]._4_4_ + center * 0xf] -
         ref_node->real[norm[2]._4_4_ + neighbor * 0xf];
  }
  ref_node_local._4_4_ = ref_node_ratio(ref_node,center,neighbor,&stack0xffffffffffffffa0);
  if (ref_node_local._4_4_ == 0) {
    if (dStack_60 * 1e+20 <= 0.0) {
      local_70 = -(dStack_60 * 1e+20);
    }
    else {
      local_70 = dStack_60 * 1e+20;
    }
    if (force <= 0.0) {
      local_80 = -force;
    }
    else {
      local_80 = force;
    }
    if (local_80 < local_70) {
      if (dStack_60 * 1e+20 <= 0.0) {
        local_88 = -(dStack_60 * 1e+20);
      }
      else {
        local_88 = dStack_60 * 1e+20;
      }
      if (norm[0] <= 0.0) {
        local_98 = -norm[0];
      }
      else {
        local_98 = norm[0];
      }
      if (local_98 < local_88) {
        if (dStack_60 * 1e+20 <= 0.0) {
          local_a0 = -(dStack_60 * 1e+20);
        }
        else {
          local_a0 = dStack_60 * 1e+20;
        }
        if (norm[1] <= 0.0) {
          local_b0 = -norm[1];
        }
        else {
          local_b0 = norm[1];
        }
        if (local_b0 < local_a0) {
          for (norm[2]._4_4_ = 0; norm[2]._4_4_ < 3; norm[2]._4_4_ = norm[2]._4_4_ + 1) {
            norm[(long)norm[2]._4_4_ + -1] = norm[(long)norm[2]._4_4_ + -1] / dStack_60;
          }
          ratio = dStack_60 * dStack_60 * dStack_60 * dStack_60;
          dVar1 = 1.0 - ratio;
          dVar2 = exp(-ratio);
          l4 = dVar1 * dVar2;
          if (dStack_60 < 1.0) {
            l4 = (1.0 - dStack_60) * (1.0 - dStack_60) + l4;
          }
          for (norm[2]._4_4_ = 0; norm[2]._4_4_ < 3; norm[2]._4_4_ = norm[2]._4_4_ + 1) {
            total_force_vector[norm[2]._4_4_] =
                 l4 * norm[(long)norm[2]._4_4_ + -1] + total_force_vector[norm[2]._4_4_];
          }
          return 0;
        }
      }
    }
    ref_node_local._4_4_ = 4;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x2e,
           "ref_smooth_add_pliant_force",(ulong)ref_node_local._4_4_,"get r0");
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_add_pliant_force(
    REF_NODE ref_node, REF_INT center, REF_INT neighbor,
    REF_DBL *total_force_vector) {
  REF_INT ixyz;
  REF_DBL norm[3], force, l4, ratio;
  for (ixyz = 0; ixyz < 3; ixyz++)
    norm[ixyz] = ref_node_xyz(ref_node, ixyz, center) -
                 ref_node_xyz(ref_node, ixyz, neighbor);
  RSS(ref_node_ratio(ref_node, center, neighbor, &ratio), "get r0");
  if (ref_math_divisible(norm[0], ratio) &&
      ref_math_divisible(norm[1], ratio) &&
      ref_math_divisible(norm[2], ratio)) {
    for (ixyz = 0; ixyz < 3; ixyz++) norm[ixyz] /= ratio;
  } else {
    return REF_DIV_ZERO;
  }
  l4 = ratio * ratio * ratio * ratio;
  force = (1.0 - l4) * exp(-l4);
  if (ratio < 1.0) force += (1.0 - ratio) * (1.0 - ratio);
  for (ixyz = 0; ixyz < 3; ixyz++)
    total_force_vector[ixyz] += force * norm[ixyz];

  /*              --->
   *              ^
   *              |
   *              |  /
   *              | /
   *              |/
   *     <--------+---------->
   *              |
   *  &(d[3]) is the minor axis (flipped to direction)
   *  direction is normalized from center to neighbor
   *  torque is direction - minor axis with axis removed
   *  torque_ratio is 1 + len(torque)
   *  torque_norm is d[0]*norm(torque) / torque_ratio
   *  torque_force is f(torque_ratio)
   *  [ also try replusive instead of attractive? ]
   */

  /*
  {
    REF_DBL mlog0[6], mlog1[6];
    REF_DBL mlog[6], m[6], d[12];
    REF_DBL direction[3];
    REF_INT im;
    REF_DBL w0, w1;
    REF_DBL ar, torque[3], dot, len;
    for (ixyz = 0; ixyz < 3; ixyz++)
      direction[ixyz] = ref_node_xyz(ref_node, ixyz, center) -
                        ref_node_xyz(ref_node, ixyz, neighbor);
    RSS(ref_math_normalize(direction), "norm direction");
    RSS(ref_node_metric_get_log(ref_node, center, mlog0), "node0 m");
    RSS(ref_node_metric_get_log(ref_node, neighbor, mlog1), "node1 m");

    w1 = 0.5;
    w0 = 0.5;
    for (im = 0; im < 6; im++) {
      mlog[im] = w0 * mlog0[im] + w1 * mlog1[im];
    }
    RSS(ref_matrix_exp_m(mlog, m), "exp");
    RSS(ref_matrix_diag_m(m, d), "diag");
    RSS(ref_matrix_ascending_eig_twod(m), "order");
    ar = sqrt(d[0] / d[2]);
    if (0.0 > ref_math_dot(direction, &(d[3]))) {
      for (ixyz = 0; ixyz < 3; ixyz++) d[3 + ixyz] = -d[3 + ixyz];
    }
    for (ixyz = 0; ixyz < 3; ixyz++)
      torque[ixyz] = direction[ixyz] - d[3 + ixyz];
    dot = ref_math_dot(&(d[3]), torque);
    for (ixyz = 0; ixyz < 3; ixyz++) torque[ixyz] -= dot * d[3 + ixyz];
    len = sqrt(ref_math_dot(torque, torque));
    if (ar > 2.0 && ABS(len) < 0.5) {
      ratio = 1.0 + len;
      RSS(ref_math_normalize(torque), "norm torque");
      for (ixyz = 0; ixyz < 3; ixyz++) torque[ixyz] *= d[0]/ratio;
      l4 = ratio * ratio * ratio * ratio;
      force = (1.0 - l4) * exp(-l4);
      for (ixyz = 0; ixyz < 3; ixyz++)
        total_force_vector[ixyz] -= torque[ixyz] * len;
    }
  }
  */

  return REF_SUCCESS;
}